

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlFindAndDeleteMin0(NodeAVL *nd,void **ptr)

{
  NodeAVL *pNVar1;
  NodeAVL *in_RSI;
  void *in_RDI;
  NodeAVL *r;
  NodeAVL *in_stack_ffffffffffffffd8;
  void **in_stack_ffffffffffffffe0;
  NodeAVL *local_8;
  
  if (*(long *)((long)in_RDI + 0x20) == 0) {
    *(undefined8 *)in_RSI = *(undefined8 *)((long)in_RDI + 0x10);
    local_8 = *(NodeAVL **)((long)in_RDI + 0x28);
    if (local_8 != (NodeAVL *)0x0) {
      local_8->parent = *(NodeAVL **)((long)in_RDI + 0x30);
    }
    free(in_RDI);
  }
  else {
    pNVar1 = avlFindAndDeleteMin0(in_RSI,in_stack_ffffffffffffffe0);
    *(NodeAVL **)((long)in_RDI + 0x20) = pNVar1;
    local_8 = avlBalance(in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

NodeAVL* avlFindAndDeleteMin0( NodeAVL *nd, void **ptr ){
    #ifdef DEBUG_AVL
      printf( "avlFindAndDeleteMin0 id=%d\n", nd->id );
    #endif
    if( !nd->left ){
        *ptr = nd->ptr;
        NodeAVL *r = nd->right;
        if (r) r->parent = nd->parent;
        free(nd);
        return r;
    }
    nd->left = avlFindAndDeleteMin0( nd->left, ptr );
    return avlBalance(nd);
}